

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

void __thiscall
boost::any::any<std::__cxx11::string&>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          type *param_2,type *param_3)

{
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  
  this_00 = (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::holder
            (this_00,value);
  this->content = (placeholder *)this_00;
  return;
}

Assistant:

any(ValueType&& value
            , typename boost::disable_if<boost::is_same<any&, ValueType> >::type* = 0 // disable if value has type `any&`
            , typename boost::disable_if<boost::is_const<ValueType> >::type* = 0) // disable if value has type `const ValueType&&`
          : content(new holder< typename decay<ValueType>::type >(static_cast<ValueType&&>(value)))
        {
        }